

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
CLI::AsSizeValue::init_mapping_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,AsSizeValue *this,bool kb_is_1000)

{
  char *pcVar1;
  result_t rVar2;
  mapped_type *pmVar3;
  mapped_type mVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator local_e9;
  undefined1 local_e8 [8];
  string p;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> local_88;
  initializer_list<const_char_*> *local_78;
  initializer_list<const_char_*> *__range1;
  allocator local_59;
  key_type local_58;
  mapped_type local_38;
  result_t ki;
  result_t k;
  result_t ki_factor;
  result_t k_factor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmStack_10;
  bool kb_is_1000_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *m;
  
  k_factor._7_1_ = (byte)this & 1;
  k_factor._6_1_ = 0;
  pmStack_10 = __return_storage_ptr__;
  _GLOBAL__N_1::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(__return_storage_ptr__);
  ki_factor = 0x400;
  if ((k_factor._7_1_ & 1) != 0) {
    ki_factor = 1000;
  }
  k = 0x400;
  ki = 1;
  local_38 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"b",&local_59);
  pmVar3 = _GLOBAL__N_1::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](__return_storage_ptr__,&local_58);
  *pmVar3 = 1;
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  memcpy(&__begin1,&DAT_00390008,0x30);
  local_88._M_array = (iterator)&__begin1;
  local_88._M_len = 6;
  local_78 = &local_88;
  __end1 = _GLOBAL__N_1::std::initializer_list<const_char_*>::begin(local_78);
  p.field_2._8_8_ = _GLOBAL__N_1::std::initializer_list<const_char_*>::end(local_78);
  for (; __end1 != (const_iterator)p.field_2._8_8_; __end1 = __end1 + 1) {
    pcVar1 = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e8,pcVar1,&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    mVar4 = ki * ki_factor;
    local_38 = local_38 * k;
    ki = mVar4;
    pmVar3 = _GLOBAL__N_1::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)local_e8);
    rVar2 = ki;
    *pmVar3 = mVar4;
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,"b"
                  );
    pmVar3 = _GLOBAL__N_1::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](__return_storage_ptr__,&local_110);
    *pmVar3 = rVar2;
    std::__cxx11::string::~string((string *)&local_110);
    mVar4 = local_38;
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,"i"
                  );
    pmVar3 = _GLOBAL__N_1::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](__return_storage_ptr__,&local_130);
    *pmVar3 = mVar4;
    std::__cxx11::string::~string((string *)&local_130);
    mVar4 = local_38;
    std::operator+(&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "ib");
    pmVar3 = _GLOBAL__N_1::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](__return_storage_ptr__,&local_150);
    *pmVar3 = mVar4;
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::map<std::string, AsSizeValue::result_t> AsSizeValue::init_mapping(bool kb_is_1000) {
    std::map<std::string, result_t> m;
    result_t k_factor = kb_is_1000 ? 1000 : 1024;
    result_t ki_factor = 1024;
    result_t k = 1;
    result_t ki = 1;
    m["b"] = 1;
    for(std::string p : {"k", "m", "g", "t", "p", "e"}) {
        k *= k_factor;
        ki *= ki_factor;
        m[p] = k;
        m[p + "b"] = k;
        m[p + "i"] = ki;
        m[p + "ib"] = ki;
    }
    return m;
}